

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int jsonParseAddNodeExpand(JsonParse *pParse,u32 eType,u32 n,char *zContent)

{
  uint uVar1;
  JsonNode *pJVar2;
  JsonNode *pNew;
  u32 nNew;
  char *zContent_local;
  u32 n_local;
  u32 eType_local;
  JsonParse *pParse_local;
  
  if (pParse->oom == '\0') {
    uVar1 = pParse->nAlloc * 2 + 10;
    pJVar2 = (JsonNode *)sqlite3_realloc64(pParse->aNode,(ulong)uVar1 << 4);
    if (pJVar2 == (JsonNode *)0x0) {
      pParse->oom = '\x01';
      pParse_local._4_4_ = -1;
    }
    else {
      pParse->nAlloc = uVar1;
      pParse->aNode = pJVar2;
      pParse_local._4_4_ = jsonParseAddNode(pParse,eType,n,zContent);
    }
  }
  else {
    pParse_local._4_4_ = -1;
  }
  return pParse_local._4_4_;
}

Assistant:

static JSON_NOINLINE int jsonParseAddNodeExpand(
  JsonParse *pParse,        /* Append the node to this object */
  u32 eType,                /* Node type */
  u32 n,                    /* Content size or sub-node count */
  const char *zContent      /* Content */
){
  u32 nNew;
  JsonNode *pNew;
  assert( pParse->nNode>=pParse->nAlloc );
  if( pParse->oom ) return -1;
  nNew = pParse->nAlloc*2 + 10;
  pNew = sqlite3_realloc64(pParse->aNode, sizeof(JsonNode)*nNew);
  if( pNew==0 ){
    pParse->oom = 1;
    return -1;
  }
  pParse->nAlloc = nNew;
  pParse->aNode = pNew;
  assert( pParse->nNode<pParse->nAlloc );
  return jsonParseAddNode(pParse, eType, n, zContent);
}